

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void __thiscall
bloaty::dwarf::ReadRangeList
          (dwarf *this,CU *cu,uint64_t low_pc,string_view name,RangeSink *sink,string_view *data)

{
  dwarf dVar1;
  uint64_t uVar2;
  CU *pCVar3;
  CU *pCVar4;
  string name_str;
  string local_58;
  RangeSink *local_38;
  
  local_38 = (RangeSink *)name._M_str;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,name._M_len,low_pc + name._M_len);
  dVar1 = this[0x2b];
  do {
    uVar2 = CompilationUnitSizes::ReadAddress
                      ((CompilationUnitSizes *)(this + 0x28),(string_view *)sink);
    pCVar3 = (CU *)CompilationUnitSizes::ReadAddress
                             ((CompilationUnitSizes *)(this + 0x28),(string_view *)sink);
    pCVar4 = cu;
    if ((pCVar3 != (CU *)0x0 || uVar2 != 0) &&
       (pCVar4 = pCVar3, uVar2 != (-(ulong)(byte)dVar1 | 0xffffffff))) {
      RangeSink::AddVMRangeIgnoreDuplicate
                (local_38,"dwarf_rangelist",(long)&cu->dwarf_ + uVar2,(long)pCVar3 - uVar2,&local_58
                );
      pCVar4 = cu;
    }
    cu = pCVar4;
  } while (pCVar3 != (CU *)0x0 || uVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ReadRangeList(const CU& cu, uint64_t low_pc, string_view name,
                   RangeSink* sink, string_view* data) {
  std::string name_str(name);
  uint64_t max_address = cu.unit_sizes().MaxAddress();
  while (true) {
    uint64_t start, end;
    start = cu.unit_sizes().ReadAddress(data);
    end = cu.unit_sizes().ReadAddress(data);
    if (start == 0 && end == 0) {
      return;
    } else if (start == max_address) {
      low_pc = end;
    } else {
      uint64_t size = end - start;
      sink->AddVMRangeIgnoreDuplicate("dwarf_rangelist", low_pc + start, size,
                                      name_str);
    }
  }
}